

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O3

int SDL_CDEject(SDL12_CD *cdrom)

{
  AudioCallbackWrapperData *pAVar1;
  char *pcVar2;
  
  if (CDRomInit == '\x01') {
    if ((cdrom != (SDL12_CD *)0x0) || (cdrom = CDRomDevice, CDRomDevice != (SDL12_CD *)0x0)) {
      (*SDL20_LockAudio)();
      pAVar1 = audio_cbdata;
      if (audio_cbdata != (AudioCallbackWrapperData *)0x0) {
        audio_cbdata->cdrom_status = SDL12_CD_TRAYEMPTY;
        FreeMp3(&pAVar1->cdrom_mp3);
      }
      cdrom->status = SDL12_CD_TRAYEMPTY;
      (*SDL20_UnlockAudio)();
      return 0;
    }
    pcVar2 = "CD-ROM not opened";
  }
  else {
    pcVar2 = "CD-ROM subsystem not initialized";
  }
  (*SDL20_SetError)(pcVar2);
  return -1;
}

Assistant:

SDLCALL
SDL_CDEject(SDL12_CD *cdrom)
{
    if ((cdrom = ValidCDDevice(cdrom)) == NULL) {
        return -1;
    }

    SDL20_LockAudio();
    if (audio_cbdata) {
        audio_cbdata->cdrom_status = SDL12_CD_TRAYEMPTY;
        FreeMp3(&audio_cbdata->cdrom_mp3);
    }
    cdrom->status = SDL12_CD_TRAYEMPTY;
    SDL20_UnlockAudio();
    return 0;
}